

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.c
# Opt level: O3

int UUID_from_string(char *uuid_string,UUID_T *uuid)

{
  char cVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  char *pcVar9;
  
  if (uuid_string == (char *)0x0 || uuid == (UUID_T *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar7 = 0x22;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x22;
    }
    pcVar9 = "Invalid argument (uuid_string=%p, uuid=%p)";
    iVar4 = 0x21;
    pcVar3 = uuid_string;
  }
  else {
    pcVar3 = (char *)strlen(uuid_string);
    if (pcVar3 == (char *)0x24) {
      pcVar3 = (char *)0x0;
      lVar5 = 0;
      while( true ) {
        bVar8 = uuid_string[(long)pcVar3];
        if (bVar8 != 0x2d) break;
        if (((char *)0x17 < pcVar3) || ((0x842100UL >> ((ulong)pcVar3 & 0x3f) & 1) == 0)) {
          p_Var2 = xlogging_get_log_function();
          iVar7 = 0x3f;
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return 0x3f;
          }
          pcVar9 = "Failed decoding UUID string (%lu)";
          iVar4 = 0x3e;
          goto LAB_001632a7;
        }
        pcVar3 = pcVar3 + 1;
LAB_00163230:
        if ((char *)0x23 < pcVar3) {
          return 0;
        }
      }
      if ((byte)(bVar8 - 0x30) < 10) {
        uVar6 = (uint)(byte)(bVar8 - 0x30);
      }
      else if ((byte)(bVar8 + 0x9f) < 6) {
        uVar6 = bVar8 - 0x57;
      }
      else {
        uVar6 = 0xffffffff;
        if ((byte)(bVar8 + 0xbf) < 6) {
          uVar6 = bVar8 - 0x37;
        }
      }
      cVar1 = (uuid_string + 1)[(long)pcVar3];
      bVar8 = cVar1 - 0x30;
      if (bVar8 < 10) {
LAB_0016321b:
        if (uVar6 != 0xffffffff) {
          (*uuid)[lVar5] = bVar8 + (char)(uVar6 << 4);
          pcVar3 = pcVar3 + 2;
          lVar5 = lVar5 + 1;
          goto LAB_00163230;
        }
      }
      else {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          bVar8 = cVar1 + 0xa9;
          goto LAB_0016321b;
        }
        if ((byte)(cVar1 + 0xbfU) < 6) {
          bVar8 = cVar1 - 0x37;
          goto LAB_0016321b;
        }
      }
      p_Var2 = xlogging_get_log_function();
      iVar7 = 0x56;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x56;
      }
      pcVar9 = "Failed decoding UUID string (%lu)";
      iVar4 = 0x55;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      iVar7 = 0x2b;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x2b;
      }
      pcVar9 = "Unexpected size for an UUID string (%lu)";
      iVar4 = 0x2a;
    }
  }
LAB_001632a7:
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/uuid.c"
            ,"UUID_from_string",iVar4,1,pcVar9,pcVar3);
  return iVar7;
}

Assistant:

int UUID_from_string(const char* uuid_string, UUID_T* uuid)
{
    int result;

    // Codes_SRS_UUID_09_007: [ If uuid_string or uuid are NULL, UUID_from_string shall return a non-zero value ]
    if (uuid_string == NULL || uuid == NULL)
    {
        LogError("Invalid argument (uuid_string=%p, uuid=%p)", uuid_string, uuid);
        result = MU_FAILURE;
    }
    else
    {
        size_t uuid_string_length = strlen(uuid_string);

        if (uuid_string_length != UUID_STRING_LENGTH)
        {
            LogError("Unexpected size for an UUID string (%lu)", (unsigned long)uuid_string_length);
            result = MU_FAILURE;
        }
        else
        {
            // Codes_SRS_UUID_09_008: [ Each pair of digits in uuid_string, excluding dashes, shall be read as a single HEX value and saved on the respective position in uuid ]
            size_t i, j;
            char* uuid_bytes;

            uuid_bytes = (char *)uuid;
            // Codes_SRS_UUID_09_010: [ If no failures occur, UUID_from_string shall return zero ]
            result = __SUCCESS__;

            for (i = 0, j = 0; i < uuid_string_length; )
            {
                if (uuid_string[i] == '-')
                {
                    if (!MUST_BE_DASH(i))
                    {
                        // Codes_SRS_UUID_09_009: [ If uuid fails to be generated, UUID_from_string shall return a non-zero value ]
                        LogError("Failed decoding UUID string (%lu)", (unsigned long)i);
                        result = MU_FAILURE;
                        break;
                    }
                    else
                    {
                        i++;
                    }
                }
                else
                {
                    int higherOrderDigit = HEXA_DIGIT_VAL(uuid_string[i]);
                    int lowerOrderDigit = HEXA_DIGIT_VAL(uuid_string[i + 1]);

#ifdef _MSC_VER
#pragma warning(disable:6328) // warning C6328: Size mismatch
#endif
                    if (higherOrderDigit == -1 || lowerOrderDigit == -1)
#ifdef _MSC_VER
#pragma warning (default:6328)
#endif
                    {
                        // Codes_SRS_UUID_09_009: [ If uuid fails to be generated, UUID_from_string shall return a non-zero value ]
                        LogError("Failed decoding UUID string (%lu)", (unsigned long)i);
                        result = MU_FAILURE;
                        break;
                    }
                    else
                    {
                        // Multiplying the higherOrderDigit by 16.
                        uuid_bytes[j] = (char)((higherOrderDigit << 4) + lowerOrderDigit);
                        i += 2;
                        j++;
                    }
                }
            }
        }
    }

    return result;
}